

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O2

void __thiscall
barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>::finished
          (barcode_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t> *this,
          bool with_cell_counts)

{
  ofstream *poVar1;
  int iVar2;
  pointer puVar3;
  ostream *poVar4;
  long lVar5;
  int iVar6;
  undefined7 in_register_00000031;
  ulong uVar7;
  int iVar8;
  size_t idx;
  
  if ((int)CONCAT71(in_register_00000031,with_cell_counts) != 0) {
    puVar3 = (this->complex->cell_count).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar6 = 0;
    for (uVar7 = 0;
        (long)(this->complex->cell_count).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar3 >> 3 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = *(int *)((long)puVar3 + (lVar5 >> 0x1d));
      iVar8 = -iVar2;
      if ((uVar7 & 1) == 0) {
        iVar8 = iVar2;
      }
      iVar6 = iVar6 + iVar8;
      lVar5 = lVar5 + 0x100000000;
    }
    if ((this->min_dimension == 0) && (this->max_dimension == 0xffff)) {
      poVar1 = &(this->
                super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>
                ).outstream;
      std::endl<char,std::char_traits<char>>((ostream *)poVar1);
      poVar4 = std::operator<<((ostream *)poVar1,"# Euler characteristic: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  poVar1 = &(this->
            super_file_output_t<directed_flag_complex_computer::directed_flag_complex_computer_t>).
            outstream;
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  poVar4 = std::operator<<((ostream *)poVar1,"# Betti numbers:");
  std::endl<char,std::char_traits<char>>(poVar4);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->betti).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->betti).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    poVar4 = std::operator<<((ostream *)poVar1,"#\t\tdim H_");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(uint)this->min_dimension + (int)uVar7);
    poVar4 = std::operator<<(poVar4," = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if ((this->skipped).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7] != 0) {
      poVar4 = std::operator<<((ostream *)poVar1," (skipped ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,")");
    }
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  }
  if (with_cell_counts) {
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    poVar4 = std::operator<<((ostream *)poVar1,"# Cell counts:");
    std::endl<char,std::char_traits<char>>(poVar4);
    for (uVar7 = (ulong)((ushort)(this->min_dimension + (ushort)(this->min_dimension == 0)) - 1);
        uVar7 <= ((long)(this->complex->cell_count).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(this->complex->cell_count).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) - 1U; uVar7 = uVar7 + 1) {
      poVar4 = std::operator<<((ostream *)poVar1,"#\t\tdim C_");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return;
}

Assistant:

void finished(bool with_cell_counts = true) {

		index_t cell_euler_characteristic = 0;
		if (with_cell_counts) {
			for (size_t i = 0; i <= complex->top_dimension(); i++)
				cell_euler_characteristic += (i % 2 == 1 ? -1 : 1) * index_t(complex->number_of_cells(index_t(i)));

			bool computed_full_homology =
			    min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
			if (computed_full_homology) {
				file_output_t<Complex>::outstream << std::endl;
				file_output_t<Complex>::outstream << "# Euler characteristic: " << cell_euler_characteristic
				                                  << std::endl;
			}
		}

		file_output_t<Complex>::outstream << std::endl;
		file_output_t<Complex>::outstream << "# Betti numbers:" << std::endl;
		int dim = 0;
		for (size_t idx = 0; idx < betti.size(); idx++) {
			file_output_t<Complex>::outstream << "#\t\tdim H_" << (min_dimension + dim++) << " = " << betti[idx];
			if (skipped[idx] > 0) file_output_t<Complex>::outstream << " (skipped " << skipped[idx] << ")";
			file_output_t<Complex>::outstream << std::endl;
		}

		if (with_cell_counts) {
			file_output_t<Complex>::outstream << std::endl;
			file_output_t<Complex>::outstream << "# Cell counts:" << std::endl;
			for (size_t i = size_t(std::max(0, min_dimension - 1)); i <= complex->top_dimension(); i++)
				file_output_t<Complex>::outstream << "#\t\tdim C_" << i << " = " << complex->number_of_cells(index_t(i))
				                                  << std::endl;
		}
	}